

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::StarExpression::Copy(StarExpression *this)

{
  bool bVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Alloc_hider _Var4;
  StarExpression *this_00;
  pointer pSVar5;
  pointer pPVar6;
  mapped_type *pmVar7;
  pointer *__ptr;
  pointer in_RSI;
  _Hash_node_base *p_Var8;
  _Head_base<0UL,_duckdb::StarExpression_*,_false> local_58;
  string local_50;
  
  this_00 = (StarExpression *)operator_new(0x110);
  pcVar2 = (in_RSI->relation_name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (in_RSI->relation_name)._M_string_length);
  StarExpression(this_00,&local_50);
  local_58._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_58);
  if (pSVar5 != in_RSI) {
    ::std::
    _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pSVar5->exclude_list,&(in_RSI->exclude_list)._M_h);
  }
  p_Var8 = (in_RSI->replace_list)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(p_Var8 + 5));
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_50,pPVar6);
      pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_58);
      pmVar7 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pSVar5->replace_list,(key_type *)(p_Var8 + 1));
      _Var4._M_p = local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)0x0;
      _Var3._M_head_impl =
           (pmVar7->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pmVar7->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)_Var4._M_p;
      if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_58);
  if (pSVar5 != in_RSI) {
    ::std::
    _Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&pSVar5->rename_list,&(in_RSI->rename_list)._M_h);
  }
  bVar1 = in_RSI->columns;
  pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_58);
  pSVar5->columns = bVar1;
  if ((in_RSI->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    local_50._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&in_RSI->expr);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_50,pPVar6);
  }
  pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_58);
  _Var4._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  _Var3._M_head_impl =
       (pSVar5->expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar5->expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var4._M_p;
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  pSVar5 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_58);
  (pSVar5->super_ParsedExpression).super_BaseExpression.type =
       (in_RSI->super_ParsedExpression).super_BaseExpression.type;
  (pSVar5->super_ParsedExpression).super_BaseExpression.expression_class =
       (in_RSI->super_ParsedExpression).super_BaseExpression.expression_class;
  ::std::__cxx11::string::_M_assign
            ((string *)&(pSVar5->super_ParsedExpression).super_BaseExpression.alias);
  (pSVar5->super_ParsedExpression).super_BaseExpression.query_location.index =
       (in_RSI->super_ParsedExpression).super_BaseExpression.query_location.index;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> StarExpression::Copy() const {
	auto copy = make_uniq<StarExpression>(relation_name);
	copy->exclude_list = exclude_list;
	for (auto &entry : replace_list) {
		copy->replace_list[entry.first] = entry.second->Copy();
	}
	copy->rename_list = rename_list;
	copy->columns = columns;
	copy->expr = expr ? expr->Copy() : nullptr;
	copy->CopyProperties(*this);
	return std::move(copy);
}